

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptWeakMap>::GetGroupObject
          (RecyclableCollectionObjectWalker<Js::JavascriptWeakMap> *this,
          ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  char16 *pcVar4;
  undefined4 *puVar5;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar6;
  RecyclableCollectionObjectDisplay<Js::JavascriptWeakMap> *this_00;
  TrackAllocData local_58;
  ResolvedObject *local_30;
  ResolvedObject *pResolvedObject_local;
  RecyclableCollectionObjectWalker<Js::JavascriptWeakMap> *this_local;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  local_30 = pResolvedObject;
  pResolvedObject_local = (ResolvedObject *)this;
  pcVar4 = Name(this);
  local_30->name = pcVar4;
  local_30->propId = -1;
  local_30->obj = this->instance;
  local_30->scriptContext = this->scriptContext;
  this_local = (RecyclableCollectionObjectWalker<Js::JavascriptWeakMap> *)local_30->obj;
  if (this_local == (RecyclableCollectionObjectWalker<Js::JavascriptWeakMap> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(this_local);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(this_local);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(this_local);
      if (pRStack_10 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_14 = RecyclableObject::GetTypeId(pRStack_10);
      if (0x57 < (int)local_14) {
        BVar3 = RecyclableObject::IsExternal(pRStack_10);
        if (BVar3 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
      }
      local_18 = local_14;
    }
  }
  local_30->typeId = local_18;
  local_30->address = (IDiagObjectAddress *)0x0;
  pAVar6 = &GetArenaFromContext(this->scriptContext)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,
             (type_info *)&RecyclableCollectionObjectDisplay<Js::JavascriptWeakMap>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
             ,0xdb2);
  pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar6,&local_58);
  this_00 = (RecyclableCollectionObjectDisplay<Js::JavascriptWeakMap> *)
            new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar6,0x3f67b0);
  RecyclableCollectionObjectDisplay<Js::JavascriptWeakMap>::RecyclableCollectionObjectDisplay
            (this_00,this->scriptContext,local_30->name,this);
  local_30->objectDisplay = (IDiagObjectModelDisplay *)this_00;
  return 1;
}

Assistant:

BOOL RecyclableCollectionObjectWalker<TData>::GetGroupObject(ResolvedObject* pResolvedObject)
    {
        pResolvedObject->name = Name();
        pResolvedObject->propId = Constants::NoProperty;
        pResolvedObject->obj = instance;
        pResolvedObject->scriptContext = scriptContext;
        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->address = nullptr;

        typedef RecyclableCollectionObjectDisplay<TData> RecyclableDataObjectDisplay;
        pResolvedObject->objectDisplay = Anew(GetArenaFromContext(scriptContext), RecyclableDataObjectDisplay, scriptContext, pResolvedObject->name, this);

        return TRUE;
    }